

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

Node * __thiscall
anon_unknown.dwarf_f615c::BuildFileImpl::getOrCreateNode
          (BuildFileImpl *this,StringRef name,bool isImplicit)

{
  bool bVar1;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
  *pSVar2;
  unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_> *this_00;
  pointer result;
  unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_> local_58;
  unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_> node;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
  local_38;
  iterator it;
  bool isImplicit_local;
  BuildFileImpl *this_local;
  StringRef name_local;
  
  it.
  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
  .Ptr._7_1_ = isImplicit;
  local_38.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
                 ::find(&this->nodes,name);
  node._M_t.
  super___uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::Node_*,_std::default_delete<llbuild::buildsystem::Node>_>
  .super__Head_base<0UL,_llbuild::buildsystem::Node_*,_false>._M_head_impl =
       (__uniq_ptr_data<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>,_true,_true>
        )llvm::
         StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
         ::end(&this->nodes);
  bVar1 = llvm::
          iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_&>
          ::operator!=((iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_&>
                        *)&local_38,
                       (StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
                        *)&node);
  if (bVar1) {
    pSVar2 = llvm::
             iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_&>
             ::operator->((iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_&>
                           *)&local_38);
    name_local.Length =
         (size_t)std::
                 unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
                 ::get(&pSVar2->second);
  }
  else {
    (*this->delegate->_vptr_BuildFileDelegate[0xc])
              (&local_58,this->delegate,name.Data,name.Length,
               (ulong)(it.
                       super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
                       .Ptr._7_1_ & 1));
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_58);
    if (!bVar1) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildFile.cpp"
                    ,0x174,
                    "Node *(anonymous namespace)::BuildFileImpl::getOrCreateNode(StringRef, bool)");
    }
    name_local.Length =
         (size_t)std::
                 unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
                 ::get(&local_58);
    this_00 = llvm::
              StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
              ::operator[](&this->nodes,name);
    std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>::
    operator=(this_00,&local_58);
    std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>::
    ~unique_ptr(&local_58);
  }
  return (Node *)name_local.Length;
}

Assistant:

Node* getOrCreateNode(StringRef name, bool isImplicit) {
    // First, check the map.
    auto it = nodes.find(name);
    if (it != nodes.end())
      return it->second.get();
    
    // Otherwise, ask the delegate to create the node.
    auto node = delegate.createNode(name, isImplicit);
    assert(node);
    auto result = node.get();
    nodes[name] = std::move(node);

    return result;
  }